

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayGet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayGet *curr)

{
  uint uVar1;
  Literal *pLVar2;
  long lVar3;
  undefined1 local_130 [8];
  Flow ref;
  Flow index;
  Field aFStack_88 [8];
  Field field;
  Literal local_70;
  Literal local_58;
  long local_40;
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_130,this,*(Expression **)(curr + 0x10));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x18));
    if (index.breakTo.super_IString.str._M_len == 0) {
      Flow::getSingleValue((Flow *)local_130);
      wasm::Literal::getGCData();
      if (local_40 == 0) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      pLVar2 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
      uVar1 = Literal::geti32(pLVar2);
      lVar3 = *(long *)(local_40 + 0x30) - *(long *)(local_40 + 0x28);
      if ((ulong)(lVar3 / 0x18 + *(long *)(local_40 + 8)) <= (ulong)uVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"array oob",lVar3 % 0x18);
      }
      Type::getHeapType((Type *)(*(long *)(curr + 0x10) + 8));
      wasm::HeapType::getArray();
      pLVar2 = (Literal *)(*(long *)(local_40 + 0x28) + -0x18 + (ulong)uVar1 * 0x18);
      if (uVar1 == 0) {
        pLVar2 = (Literal *)(local_40 + 0x10);
      }
      wasm::Literal::Literal(&local_58,pLVar2);
      extendForPacking(&local_70,this,&local_58,aFStack_88,(bool)curr[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_70);
      wasm::Literal::~Literal(&local_70);
      wasm::Literal::~Literal(&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_130);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_130);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayGet(ArrayGet* curr) {
    NOTE_ENTER("ArrayGet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    Index i = index.getSingleValue().geti32();
    if (i >= data->values.size()) {
      trap("array oob");
    }
    auto field = curr->ref->type.getHeapType().getArray().element;
    return extendForPacking(data->values[i], field, curr->signed_);
  }